

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstExprTest(void)

{
  int iVar1;
  
  ConstExprTestT<char>();
  ConstExprTestT<signed_char>();
  ConstExprTestT<unsigned_char>();
  ConstExprTestT<short>();
  ConstExprTestT<unsigned_short>();
  ConstExprTestT<int>();
  ConstExprTestT<unsigned_int>();
  ConstExprTestT<long>();
  ConstExprTestT<unsigned_long>();
  ConstExprTestT<long_long>();
  ConstExprTestT<unsigned_long_long>();
  if (ConstExprTest()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstExprTest()::pt);
    if (iVar1 != 0) {
      ConstExprTest::pt.m_int = 1;
      __cxa_guard_release(&ConstExprTest()::pt);
      return;
    }
  }
  return;
}

Assistant:

void ConstExprTest()
	{
		ConstExprTestT<char>();
		ConstExprTestT<signed char>();
		ConstExprTestT<unsigned char>();
		ConstExprTestT<signed short>();
		ConstExprTestT<unsigned short>();
		ConstExprTestT<signed int>();
		ConstExprTestT<unsigned int>();
		ConstExprTestT<signed long>();
		ConstExprTestT<unsigned long>();
		ConstExprTestT<signed long long>();
		ConstExprTestT<unsigned long long>();

		// Catch the SafePtrDiff function, since it is marked. Can't think of a scenario for this being constexpr, though.
		const char* p1 = (char*)1;
		const char* p2 = nullptr;

		static const SafeInt<ptrdiff_t> pt = SafePtrDiff(p1, p2);
		if (pt > 0)
			return;
	}